

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdialogbuttonbox.cpp
# Opt level: O0

void QDialogButtonBox::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long lVar1;
  bool bVar2;
  QObject QVar3;
  Orientation OVar4;
  QtMocHelpers *in_RCX;
  Int in_EDX;
  int in_ESI;
  long in_FS_OFFSET;
  void *_v_1;
  void *_v;
  QDialogButtonBox *_t;
  undefined4 in_stack_ffffffffffffff58;
  QFlagsStorage<QDialogButtonBox::StandardButton> in_stack_ffffffffffffff5c;
  QDialogButtonBox *in_stack_ffffffffffffff60;
  QDialogButtonBox *pQVar5;
  QFlagsStorage<QDialogButtonBox::StandardButton> in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    switch(in_EDX) {
    case 0:
      clicked((QDialogButtonBox *)0x66ea62,
              (QAbstractButton *)CONCAT44(in_stack_ffffffffffffff5c.i,in_stack_ffffffffffffff58));
      break;
    case 1:
      accepted((QDialogButtonBox *)0x66ea6e);
      break;
    case 2:
      helpRequested((QDialogButtonBox *)0x66ea7a);
      break;
    case 3:
      rejected((QDialogButtonBox *)0x66ea86);
    }
  }
  if ((in_ESI != 5) ||
     ((((bVar2 = QtMocHelpers::indexOfMethod<void(QDialogButtonBox::*)(QAbstractButton*)>
                           (in_RCX,(void **)clicked,0,0), !bVar2 &&
        (bVar2 = QtMocHelpers::indexOfMethod<void(QDialogButtonBox::*)()>
                           (in_RCX,(void **)accepted,0,1), !bVar2)) &&
       (bVar2 = QtMocHelpers::indexOfMethod<void(QDialogButtonBox::*)()>
                          (in_RCX,(void **)helpRequested,0,2), !bVar2)) &&
      (bVar2 = QtMocHelpers::indexOfMethod<void(QDialogButtonBox::*)()>
                         (in_RCX,(void **)rejected,0,3), !bVar2)))) {
    if (in_ESI == 1) {
      pQVar5 = *(QDialogButtonBox **)in_RCX;
      in_stack_ffffffffffffff6c.i = in_EDX;
      if (in_EDX == 0) {
        OVar4 = orientation((QDialogButtonBox *)0x66ebd8);
        *(Orientation *)&pQVar5->super_QWidget = OVar4;
      }
      else if (in_EDX == 1) {
        standardButtons((QDialogButtonBox *)
                        CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
        QtMocHelpers::assignFlags<QFlags<QDialogButtonBox::StandardButton>>
                  ((void *)0x66ec09,
                   (QFlags<QDialogButtonBox::StandardButton>)in_stack_ffffffffffffff5c.i);
        in_stack_ffffffffffffff60 = pQVar5;
      }
      else if (in_EDX == 2) {
        QVar3 = (QObject)centerButtons(in_stack_ffffffffffffff60);
        (pQVar5->super_QWidget).super_QObject = QVar3;
      }
    }
    if (in_ESI == 2) {
      if (in_EDX == 0) {
        setOrientation(in_stack_ffffffffffffff60,0);
      }
      else if (in_EDX == 1) {
        setStandardButtons(in_stack_ffffffffffffff60,(StandardButtons)in_stack_ffffffffffffff6c.i);
      }
      else if (in_EDX == 2) {
        setCenterButtons(in_stack_ffffffffffffff60,false);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDialogButtonBox::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QDialogButtonBox *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->clicked((*reinterpret_cast< std::add_pointer_t<QAbstractButton*>>(_a[1]))); break;
        case 1: _t->accepted(); break;
        case 2: _t->helpRequested(); break;
        case 3: _t->rejected(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QDialogButtonBox::*)(QAbstractButton * )>(_a, &QDialogButtonBox::clicked, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDialogButtonBox::*)()>(_a, &QDialogButtonBox::accepted, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDialogButtonBox::*)()>(_a, &QDialogButtonBox::helpRequested, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDialogButtonBox::*)()>(_a, &QDialogButtonBox::rejected, 3))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<Qt::Orientation*>(_v) = _t->orientation(); break;
        case 1: QtMocHelpers::assignFlags<StandardButtons>(_v, _t->standardButtons()); break;
        case 2: *reinterpret_cast<bool*>(_v) = _t->centerButtons(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setOrientation(*reinterpret_cast<Qt::Orientation*>(_v)); break;
        case 1: _t->setStandardButtons(*reinterpret_cast<StandardButtons*>(_v)); break;
        case 2: _t->setCenterButtons(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}